

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountAggregate.cpp
# Opt level: O2

void __thiscall CountAggregate::~CountAggregate(CountAggregate *this)

{
  int **ppiVar1;
  long lVar2;
  void *pvVar3;
  pointer pvVar4;
  size_t j;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  
  (this->super_MachineLearningModel)._vptr_MachineLearningModel =
       (_func_int **)&PTR__CountAggregate_00152bb0;
  uVar6 = dfdb::params::NUM_OF_FEATURES;
  for (uVar5 = 0; ppiVar1 = this->_features, uVar5 < uVar6; uVar5 = uVar5 + 1) {
    if (ppiVar1[uVar5] != (int *)0x0) {
      operator_delete__(ppiVar1[uVar5]);
      uVar6 = dfdb::params::NUM_OF_FEATURES;
    }
  }
  if (ppiVar1 != (int **)0x0) {
    operator_delete__(ppiVar1);
  }
  pvVar4 = (this->_aggregateRegister).
           super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar6 = 0;
      uVar6 < (ulong)(((long)(this->_aggregateRegister).
                             super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18);
      uVar6 = uVar6 + 1) {
    for (uVar5 = 0;
        lVar2 = *(long *)&pvVar4[uVar6].super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                          super__Vector_impl_data,
        uVar5 < (ulong)((long)*(pointer *)
                               ((long)&pvVar4[uVar6].
                                       super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                                       super__Vector_impl_data + 8) - lVar2 >> 3); uVar5 = uVar5 + 1
        ) {
      pvVar3 = *(void **)(lVar2 + uVar5 * 8);
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
        pvVar4 = (this->_aggregateRegister).
                 super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  if (this->_numberOfAggregatesPerNode != (int *)0x0) {
    operator_delete__(this->_numberOfAggregatesPerNode);
  }
  if (this->_degreeOfLocalAggregates != (int *)0x0) {
    operator_delete__(this->_degreeOfLocalAggregates);
  }
  for (uVar6 = 0; uVar6 < _NUM_OF_ATTRIBUTES; uVar6 = uVar6 + 1) {
    if (uVar6 != (long)((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->_root->_id) {
      if (this->aggPlaceholder[uVar6] != (int *)0x0) {
        operator_delete__(this->aggPlaceholder[uVar6]);
      }
      if (this->lineagePlaceholder[uVar6] != (int *)0x0) {
        operator_delete__(this->lineagePlaceholder[uVar6]);
      }
    }
  }
  if (this->aggPlaceholder != (int **)0x0) {
    operator_delete__(this->aggPlaceholder);
  }
  if (this->lineagePlaceholder != (int **)0x0) {
    operator_delete__(this->lineagePlaceholder);
  }
  if (this->_cofactorMatrix != (ResultType *)0x0) {
    operator_delete__(this->_cofactorMatrix);
  }
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector(&this->_lineageRegister);
  std::
  vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  ::~vector(&this->_aggregateRegister);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_fade).super___shared_ptr<Fade,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->_fadeAggregates).categoricalAggregates.
              super__Vector_base<double,_std::allocator<double>_>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_launcher).super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__cxx11::string::~string((string *)&this->_pathToFiles);
  return;
}

Assistant:

CountAggregate::~CountAggregate()
{
    for (size_t i = 0; i < NUM_OF_FEATURES; ++i)
        delete[] _features[i];
    delete[] _features;

    for (size_t i = 0; i < _aggregateRegister.size(); ++i)
        for (size_t j = 0; j < _aggregateRegister[i].size(); ++j)
            delete[] _aggregateRegister[i][j];

    delete[] _numberOfAggregatesPerNode;
    delete[] _degreeOfLocalAggregates;
    
    for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
    {
        if (i != (size_t) _dTree->_root->_id)
        {
            delete[] aggPlaceholder[i];
            delete[] lineagePlaceholder[i];
        }
    }

    delete[] aggPlaceholder;
    delete[] lineagePlaceholder;
    delete[] _cofactorMatrix;
}